

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  u32 N;
  char *zIn;
  sqlite3_value *pVal;
  long lVar3;
  JsonString local_b8;
  
  if ((argc & 1U) != 0) {
    ctx->isError = 1;
    sqlite3VdbeMemSetStr
              (ctx->pOut,"json_object() requires an even number of arguments",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  local_b8.zBuf = local_b8.zSpace;
  local_b8.nAlloc = 100;
  local_b8.nUsed = 0;
  local_b8.bStatic = '\x01';
  local_b8.bErr = '\0';
  local_b8.pCtx = ctx;
  jsonAppendChar(&local_b8,'{');
  if (0 < argc) {
    lVar3 = 0;
    do {
      pVal = argv[lVar3];
      if ((pVal->flags & 0xf) != 2) {
        ctx->isError = 1;
        sqlite3VdbeMemSetStr
                  (ctx->pOut,"json_object() labels must be TEXT",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        if (local_b8.bStatic != '\0') {
          return;
        }
        sqlite3_free(local_b8.zBuf);
        return;
      }
      if ((local_b8.nUsed != 0) && ((local_b8.zBuf[local_b8.nUsed - 1] & 0xdfU) != 0x5b)) {
        jsonAppendChar(&local_b8,',');
        pVal = argv[lVar3];
      }
      zIn = (char *)sqlite3ValueText(pVal,'\x01');
      N = sqlite3ValueBytes(argv[lVar3],'\x01');
      jsonAppendString(&local_b8,zIn,N);
      jsonAppendChar(&local_b8,':');
      jsonAppendValue(&local_b8,argv[lVar3 + 1]);
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < argc);
  }
  jsonAppendChar(&local_b8,'}');
  if (local_b8.bErr == '\0') {
    sqlite3_result_text64
              (local_b8.pCtx,local_b8.zBuf,local_b8.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_b8.bStatic != '\0') | 0x11cace),'\x01');
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}